

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O2

bool __thiscall WellFounded::propRule(WellFounded *this,ConjRule *r)

{
  uint uVar1;
  bool *pbVar2;
  uint uVar3;
  int x;
  uint local_2c;
  ConjRule *local_28;
  
  uVar3 = r->w;
  pbVar2 = (this->no_support_bool).data;
  do {
    if ((int)uVar3 < 0) {
      pbVar2[(uint)r->head] = false;
      vec<int>::push(&this->nfset,&r->head);
      (this->support).data[(uint)r->head] = r;
LAB_001aa137:
      return SUB41(uVar3 >> 0x1f,0);
    }
    uVar1 = r->body[uVar3];
    if (pbVar2[uVar1] != false) {
      local_2c = uVar1;
      local_28 = r;
      vec<ConjRule_*>::push((this->watches).data + uVar1,&local_28);
      if ((this->ufset_bool).data[uVar1] == false) {
        vec<int>::push(&this->ufset,(int *)&local_2c);
        (this->ufset_bool).data[local_2c] = true;
      }
      goto LAB_001aa137;
    }
    uVar3 = uVar3 - 1;
    r->w = uVar3;
  } while( true );
}

Assistant:

bool propRule(ConjRule& r) {
		for (; r.w >= 0; r.w--) {
			if (no_support_bool[r.body[r.w]]) {
				break;
			}
		}
		if (r.w < 0) {
			if (DEBUG) {
				printf("found support for %d\n", r.head);
			}
			// all literals are founded, make h founded.
			no_support_bool[r.head] = false;
			nfset.push(r.head);
			support[r.head] = &r;
			return true;
		}
		const int x = r.body[r.w];
		watches[x].push(&r);
		if (!ufset_bool[x]) {
			if (DEBUG) {
				printf("%d added to ufset\n", x);
			}
			ufset.push(x);
			ufset_bool[x] = true;
		}
		return false;
	}